

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.h
# Opt level: O2

ChFrame<double> * __thiscall
chrono::ChPhysicsItem::GetVisualModelFrame
          (ChFrame<double> *__return_storage_ptr__,ChPhysicsItem *this,uint nclone)

{
  ChVector<double> local_48;
  ChQuaternion<double> local_28;
  
  local_48.m_data[2] = 0.0;
  local_28.m_data[0] = 1.0;
  local_28.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_28.m_data[1] = 0.0;
  local_28.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(__return_storage_ptr__,&local_48,&local_28);
  return __return_storage_ptr__;
}

Assistant:

virtual ChFrame<> GetVisualModelFrame(unsigned int nclone = 0) { return ChFrame<>(); }